

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O3

ptr<resp_appendix> __thiscall nuraft::resp_appendix::deserialize(resp_appendix *this,buffer *buf)

{
  uint8_t uVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ptr<resp_appendix> pVar4;
  buffer_serializer bs;
  buffer_serializer bStack_38;
  
  buffer_serializer::buffer_serializer(&bStack_38,buf,LITTLE);
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_005b15e8;
  *(undefined1 *)(puVar2 + 2) = 0;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined8 **)this = puVar2 + 2;
  uVar1 = buffer_serializer::get_u8(&bStack_38);
  _Var3._M_pi = extraout_RDX;
  if (uVar1 == '\0') {
    uVar1 = buffer_serializer::get_u8(&bStack_38);
    *(uint8_t *)(puVar2 + 2) = uVar1;
    _Var3._M_pi = extraout_RDX_00;
  }
  pVar4.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar4.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<resp_appendix>)
         pVar4.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<resp_appendix> deserialize(buffer& buf) {
        buffer_serializer bs(buf);
        ptr<resp_appendix> res = cs_new<resp_appendix>();

        uint8_t cur_ver = bs.get_u8();
        if (cur_ver != 0) {
            // Not supported version.
            return res;
        }

        res->extra_order_ = static_cast<extra_order>(bs.get_u8());
        return res;
    }